

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlExpandPEsInEntityValue(xmlParserCtxtPtr ctxt,xmlSBuf *buf,xmlChar *str,int length,int depth)

{
  byte bVar1;
  xmlEntityType xVar2;
  getParameterEntitySAXFunc p_Var3;
  xmlEntityPtr pxVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  xmlEntityPtr pxVar8;
  xmlChar *pxVar9;
  xmlParserInputPtr pxVar10;
  xmlParserInputPtr *ppxVar11;
  size_t sVar12;
  byte *pbVar13;
  byte *pbVar14;
  ulong uVar15;
  unsigned_long uVar16;
  xmlChar *in_stack_ffffffffffffff68;
  byte *local_88;
  xmlChar *local_80;
  byte *local_78;
  xmlSBuf *local_70;
  int local_64;
  int local_60;
  int local_5c;
  size_t local_58;
  ulong local_50;
  xmlParserInputPtr *local_48;
  xmlParserInputPtr local_40;
  xmlChar *local_38;
  
  if (str != (xmlChar *)0x0) {
    iVar6 = 0x28;
    if ((ctxt->options & 0x80000) == 0) {
      iVar6 = 0x14;
    }
    local_88 = str;
    if (depth < iVar6) {
      pbVar13 = str + length;
      if (str < pbVar13) {
        local_5c = depth + 1;
        do {
          if (1 < ctxt->disableSAX) break;
          bVar1 = *local_88;
          iVar6 = (int)str;
          if ((char)bVar1 < '\0') {
            uVar7 = xmlUTF8MultibyteLen(ctxt,local_88,"invalid character in entity value\n");
            if (uVar7 == 0) {
LAB_00133e29:
              if (str < local_88) {
                xmlSBufAddString(buf,str,(int)local_88 - iVar6);
              }
              xmlSBufAddString(buf,(xmlChar *)anon_var_dwarf_11f0b,3);
              str = local_88 + 1;
              local_88 = str;
            }
            else {
              local_88 = local_88 + uVar7;
            }
          }
          else {
            uVar7 = (uint)bVar1;
            if (uVar7 == 0x25) {
              if (str < local_88) {
                xmlSBufAddString(buf,str,(int)local_88 - iVar6);
              }
              if ((local_88 == (byte *)0x0) || (local_78 = local_88, *local_88 != 0x25)) {
                pxVar8 = (xmlEntityPtr)0x0;
              }
              else {
                local_78 = local_88 + 1;
                local_70 = buf;
                pxVar9 = xmlParseStringName(ctxt,&local_78);
                pbVar14 = local_78;
                if (pxVar9 == (xmlChar *)0x0) {
                  in_stack_ffffffffffffff68 = (xmlChar *)0x0;
                  xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_NAME_REQUIRED,
                             XML_ERR_FATAL,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                             "xmlParseStringPEReference: no name\n");
                  local_88 = local_78;
                }
                else {
                  if (*local_78 == 0x3b) {
                    pbVar14 = local_78 + 1;
                    ctxt->hasPErefs = 1;
                    local_78 = pbVar14;
                    if ((ctxt->sax == (_xmlSAXHandler *)0x0) ||
                       (p_Var3 = ctxt->sax->getParameterEntity,
                       p_Var3 == (getParameterEntitySAXFunc)0x0)) {
                      pxVar8 = (xmlEntityPtr)0x0;
                    }
                    else {
                      pxVar8 = (*p_Var3)(ctxt->userData,pxVar9);
                    }
                    if (pxVar8 == (xmlEntityPtr)0x0) {
                      xmlHandleUndeclaredEntity(ctxt,pxVar9);
                    }
                    else if ((pxVar8->etype & ~XML_INTERNAL_GENERAL_ENTITY) !=
                             XML_INTERNAL_PARAMETER_ENTITY) {
                      in_stack_ffffffffffffff68 = pxVar9;
                      xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_WAR_UNDECLARED_ENTITY,
                                 XML_ERR_WARNING,pxVar9,(xmlChar *)0x0,(xmlChar *)0x0,0,
                                 "%%%s; is not a parameter entity\n",pxVar9,0);
                    }
                    (*xmlFree)(pxVar9);
                    buf = local_70;
                    local_88 = pbVar14;
                    goto LAB_00133f59;
                  }
                  xmlFatalErr(ctxt,XML_ERR_ENTITYREF_SEMICOL_MISSING,(char *)0x0);
                  (*xmlFree)(pxVar9);
                  local_88 = pbVar14;
                }
                pxVar8 = (xmlEntityPtr)0x0;
                buf = local_70;
              }
LAB_00133f59:
              if (pxVar8 == (xmlEntityPtr)0x0) {
LAB_0013443e:
                bVar5 = false;
              }
              else if ((ctxt->inSubset == 2) ||
                      ((pxVar4 = ctxt->input->entity, pxVar4 != (xmlEntityPtr)0x0 &&
                       (pxVar4->etype == XML_EXTERNAL_PARAMETER_ENTITY)))) {
                if (pxVar8->content == (xmlChar *)0x0) {
                  if (((ctxt->options & 0x800000) == 0) &&
                     ((ctxt->replaceEntities != 0 || (ctxt->validate != 0)))) {
                    if ((ctxt == (xmlParserCtxtPtr)0x0) ||
                       ((xVar2 = pxVar8->etype, xVar2 != XML_EXTERNAL_GENERAL_PARSED_ENTITY &&
                        (xVar2 != XML_EXTERNAL_PARAMETER_ENTITY)))) {
                      xmlFatalErr(ctxt,XML_ERR_ARGUMENT,"xmlLoadEntityContent parameter error");
                    }
                    else {
                      pxVar10 = xmlLoadResource(ctxt,(char *)pxVar8->URI,(char *)pxVar8->ExternalID,
                                                (xVar2 == XML_EXTERNAL_PARAMETER_ENTITY) +
                                                XML_RESOURCE_GENERAL_ENTITY);
                      if (pxVar10 != (xmlParserInputPtr)0x0) {
                        local_38 = ctxt->encoding;
                        local_40 = ctxt->input;
                        local_60 = ctxt->inputNr;
                        local_64 = ctxt->inputMax;
                        local_48 = ctxt->inputTab;
                        ctxt->input = (xmlParserInputPtr)0x0;
                        ctxt->inputNr = 0;
                        ctxt->inputMax = 1;
                        ctxt->encoding = (xmlChar *)0x0;
                        ppxVar11 = (xmlParserInputPtr *)(*xmlMalloc)(8);
                        ctxt->inputTab = ppxVar11;
                        if (ppxVar11 == (xmlParserInputPtr *)0x0) {
                          xmlCtxtErrMemory(ctxt);
LAB_0013436d:
                          xmlFreeInputStream(pxVar10);
LAB_0013437f:
                          local_80 = (xmlChar *)0x0;
                        }
                        else {
                          xmlBufResetInput(pxVar10->buf->buffer,pxVar10);
                          iVar6 = xmlCtxtPushInput(ctxt,pxVar10);
                          if (iVar6 < 0) goto LAB_0013436d;
                          local_70 = buf;
                          xmlDetectEncoding(ctxt);
                          pxVar9 = ctxt->input->cur;
                          if (((((*pxVar9 == '<') && (pxVar9[1] == '?')) && (pxVar9[2] == 'x')) &&
                              ((pxVar9[3] == 'm' && (pxVar9[4] == 'l')))) &&
                             (((ulong)pxVar9[5] < 0x21 &&
                              ((0x100002600U >> ((ulong)pxVar9[5] & 0x3f) & 1) != 0)))) {
                            xmlParseTextDecl(ctxt);
                            iVar6 = xmlStrEqual(ctxt->version,"1.0");
                            if ((iVar6 != 0) &&
                               (iVar6 = xmlStrEqual(ctxt->input->version,"1.0"), iVar6 == 0)) {
                              in_stack_ffffffffffffff68 = (xmlChar *)0x0;
                              xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,
                                         XML_ERR_VERSION_MISMATCH,XML_ERR_FATAL,(xmlChar *)0x0,
                                         (xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                                         "Version mismatch between document and entity\n");
                            }
                          }
                          uVar15 = (long)pxVar10->cur - (long)pxVar10->base;
                          xmlBufShrink(pxVar10->buf->buffer,uVar15);
                          uVar16 = uVar15 + ctxt->sizeentities;
                          if (CARRY8(uVar15,ctxt->sizeentities)) {
                            uVar16 = 0xffffffffffffffff;
                          }
                          ctxt->sizeentities = uVar16;
                          do {
                            iVar6 = xmlParserInputBufferGrow(pxVar10->buf,0x1000);
                          } while (0 < iVar6);
                          xmlBufResetInput(pxVar10->buf->buffer,pxVar10);
                          if (-1 < iVar6) {
                            sVar12 = xmlBufUse(pxVar10->buf->buffer);
                            buf = local_70;
                            if ((sVar12 & 0xffffffff80000000) == 0) {
                              local_58 = sVar12;
                              pxVar9 = xmlBufContent(pxVar10->buf->buffer);
                              sVar12 = local_58;
                              local_80 = xmlStrndup(pxVar9,(int)local_58);
                              if (local_80 != (xmlChar *)0x0) {
                                uVar15 = 0;
                                do {
                                  if (sVar12 <= uVar15) {
                                    uVar16 = ctxt->sizeentities + sVar12;
                                    if (CARRY8(ctxt->sizeentities,sVar12)) {
                                      uVar16 = 0xffffffffffffffff;
                                    }
                                    ctxt->sizeentities = uVar16;
                                    pxVar8->content = local_80;
                                    pxVar8->length = (int)sVar12;
                                    goto LAB_0013437f;
                                  }
                                  local_78 = (byte *)CONCAT44(local_78._4_4_,
                                                              (int)sVar12 - (int)uVar15);
                                  pbVar14 = local_80 + uVar15;
                                  local_50 = uVar15;
                                  uVar7 = xmlGetUTF8Char(pbVar14,(int *)&local_78);
                                  if ((int)uVar7 < 0) {
LAB_00134288:
                                    uVar7 = (uint)*pbVar14;
                                    in_stack_ffffffffffffff68 =
                                         (xmlChar *)
                                         CONCAT44((int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                                                  uVar7);
                                    bVar5 = false;
                                    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,
                                               XML_ERR_INVALID_CHAR,XML_ERR_FATAL,(xmlChar *)0x0,
                                               (xmlChar *)0x0,(xmlChar *)0x0,uVar7,
                                               "xmlLoadEntityContent: invalid char value %d\n",
                                               in_stack_ffffffffffffff68);
                                    uVar15 = local_50;
                                  }
                                  else {
                                    if ((int)uVar7 < 0x100) {
                                      if (((int)uVar7 < 0x20) &&
                                         ((0xd < uVar7 || ((0x2600U >> (uVar7 & 0x1f) & 1) == 0))))
                                      goto LAB_00134288;
                                    }
                                    else if ((0xfffff < uVar7 - 0x10000 && 0x1ffd < uVar7 - 0xe000)
                                             && 0xd7ff < (int)uVar7) goto LAB_00134288;
                                    bVar5 = true;
                                    uVar15 = local_50 + (long)(int)local_78;
                                  }
                                  sVar12 = local_58;
                                  buf = local_70;
                                } while (bVar5);
                                goto LAB_001343dd;
                              }
                            }
                            xmlCtxtErrMemory(ctxt);
                            goto LAB_0013437f;
                          }
                          xmlCtxtErrIO(ctxt,pxVar10->buf->error,(char *)0x0);
                          local_80 = (xmlChar *)0x0;
                          buf = local_70;
                        }
LAB_001343dd:
                        while( true ) {
                          uVar7 = ctxt->inputNr;
                          if ((int)uVar7 < 1) break;
                          iVar6 = uVar7 - 1;
                          ctxt->inputNr = iVar6;
                          if (uVar7 == 1) {
                            pxVar10 = (xmlParserInputPtr)0x0;
                          }
                          else {
                            pxVar10 = ctxt->inputTab[(ulong)uVar7 - 2];
                          }
                          ctxt->input = pxVar10;
                          pxVar10 = ctxt->inputTab[iVar6];
                          ctxt->inputTab[iVar6] = (xmlParserInputPtr)0x0;
                          xmlFreeInputStream(pxVar10);
                        }
                        (*xmlFree)(ctxt->inputTab);
                        (*xmlFree)(ctxt->encoding);
                        ctxt->input = local_40;
                        ctxt->inputNr = local_60;
                        ctxt->inputMax = local_64;
                        ctxt->inputTab = local_48;
                        ctxt->encoding = local_38;
                        (*xmlFree)(local_80);
                      }
                    }
                  }
                  else {
                    in_stack_ffffffffffffff68 = pxVar8->name;
                    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ENTITY_PROCESSING,
                               XML_ERR_WARNING,in_stack_ffffffffffffff68,(xmlChar *)0x0,
                               (xmlChar *)0x0,0,
                               "not validating will not read content for PE entity %s\n",
                               in_stack_ffffffffffffff68,0);
                  }
                }
                iVar6 = xmlParserEntityCheck(ctxt,(long)pxVar8->length);
                if (iVar6 != 0) goto LAB_0013443e;
                if ((pxVar8->flags & 8U) == 0) {
                  pxVar8->flags = pxVar8->flags | 8;
                  xmlExpandPEsInEntityValue(ctxt,buf,pxVar8->content,pxVar8->length,local_5c);
                  *(byte *)&pxVar8->flags = (byte)pxVar8->flags & 0xf7;
                  bVar5 = true;
                  str = local_88;
                }
                else {
                  bVar5 = false;
                  xmlFatalErr(ctxt,XML_ERR_ENTITY_LOOP,(char *)0x0);
                  xmlHaltParser(ctxt);
                }
              }
              else {
                bVar5 = false;
                xmlFatalErr(ctxt,XML_ERR_ENTITY_PE_INTERNAL,(char *)0x0);
              }
              if (!bVar5) {
                return;
              }
            }
            else if (uVar7 == 0x26) {
              if (local_88[1] == 0x23) {
                if (str < local_88) {
                  xmlSBufAddString(buf,str,(int)local_88 - iVar6);
                }
                iVar6 = xmlParseStringCharRef(ctxt,&local_88);
                if (iVar6 == 0) {
                  return;
                }
                xmlSBufAddChar(buf,iVar6);
                str = local_88;
              }
              else {
                local_88 = local_88 + 1;
                pxVar9 = xmlParseStringName(ctxt,&local_88);
                if ((pxVar9 == (xmlChar *)0x0) ||
                   (pbVar14 = local_88 + 1, bVar1 = *local_88, local_88 = pbVar14, bVar1 != 0x3b)) {
                  xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ENTITY_CHAR_ERROR,
                             XML_ERR_FATAL,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                             "EntityValue: \'&\' forbidden except for entities references\n");
                  (*xmlFree)(pxVar9);
                  return;
                }
                (*xmlFree)(pxVar9);
              }
            }
            else {
              if ((bVar1 < 0x20) && ((0xd < uVar7 || ((0x2600U >> (uVar7 & 0x1f) & 1) == 0)))) {
                in_stack_ffffffffffffff68 = (xmlChar *)0x0;
                xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_INVALID_CHAR,XML_ERR_FATAL,
                           (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                           "invalid character in entity value\n");
                goto LAB_00133e29;
              }
              local_88 = local_88 + 1;
            }
          }
        } while (local_88 < pbVar13);
      }
      if (str < local_88) {
        xmlSBufAddString(buf,str,(int)local_88 - (int)str);
      }
    }
    else {
      xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_RESOURCE_LIMIT,XML_ERR_FATAL,
                 (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                 "Maximum entity nesting depth exceeded");
    }
  }
  return;
}

Assistant:

static void
xmlExpandPEsInEntityValue(xmlParserCtxtPtr ctxt, xmlSBuf *buf,
                          const xmlChar *str, int length, int depth) {
    int maxDepth = (ctxt->options & XML_PARSE_HUGE) ? 40 : 20;
    const xmlChar *end, *chunk;
    int c, l;

    if (str == NULL)
        return;

    depth += 1;
    if (depth > maxDepth) {
	xmlFatalErrMsg(ctxt, XML_ERR_RESOURCE_LIMIT,
                       "Maximum entity nesting depth exceeded");
	return;
    }

    end = str + length;
    chunk = str;

    while ((str < end) && (!PARSER_STOPPED(ctxt))) {
        c = *str;

        if (c >= 0x80) {
            l = xmlUTF8MultibyteLen(ctxt, str,
                    "invalid character in entity value\n");
            if (l == 0) {
                if (chunk < str)
                    xmlSBufAddString(buf, chunk, str - chunk);
                xmlSBufAddReplChar(buf);
                str += 1;
                chunk = str;
            } else {
                str += l;
            }
        } else if (c == '&') {
            if (str[1] == '#') {
                if (chunk < str)
                    xmlSBufAddString(buf, chunk, str - chunk);

                c = xmlParseStringCharRef(ctxt, &str);
                if (c == 0)
                    return;

                xmlSBufAddChar(buf, c);

                chunk = str;
            } else {
                xmlChar *name;

                /*
                 * General entity references are checked for
                 * syntactic validity.
                 */
                str++;
                name = xmlParseStringName(ctxt, &str);

                if ((name == NULL) || (*str++ != ';')) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_CHAR_ERROR,
                            "EntityValue: '&' forbidden except for entities "
                            "references\n");
                    xmlFree(name);
                    return;
                }

                xmlFree(name);
            }
        } else if (c == '%') {
            xmlEntityPtr ent;

            if (chunk < str)
                xmlSBufAddString(buf, chunk, str - chunk);

            ent = xmlParseStringPEReference(ctxt, &str);
            if (ent == NULL)
                return;

            if (!PARSER_EXTERNAL(ctxt)) {
                xmlFatalErr(ctxt, XML_ERR_ENTITY_PE_INTERNAL, NULL);
                return;
            }

            if (ent->content == NULL) {
                /*
                 * Note: external parsed entities will not be loaded,
                 * it is not required for a non-validating parser to
                 * complete external PEReferences coming from the
                 * internal subset
                 */
                if (((ctxt->options & XML_PARSE_NO_XXE) == 0) &&
                    ((ctxt->replaceEntities) ||
                     (ctxt->validate))) {
                    xmlLoadEntityContent(ctxt, ent);
                } else {
                    xmlWarningMsg(ctxt, XML_ERR_ENTITY_PROCESSING,
                                  "not validating will not read content for "
                                  "PE entity %s\n", ent->name, NULL);
                }
            }

            /*
             * TODO: Skip if ent->content is still NULL.
             */

            if (xmlParserEntityCheck(ctxt, ent->length))
                return;

            if (ent->flags & XML_ENT_EXPANDING) {
                xmlFatalErr(ctxt, XML_ERR_ENTITY_LOOP, NULL);
                xmlHaltParser(ctxt);
                return;
            }

            ent->flags |= XML_ENT_EXPANDING;
            xmlExpandPEsInEntityValue(ctxt, buf, ent->content, ent->length,
                                      depth);
            ent->flags &= ~XML_ENT_EXPANDING;

            chunk = str;
        } else {
            /* Normal ASCII char */
            if (!IS_BYTE_CHAR(c)) {
                xmlFatalErrMsg(ctxt, XML_ERR_INVALID_CHAR,
                        "invalid character in entity value\n");
                if (chunk < str)
                    xmlSBufAddString(buf, chunk, str - chunk);
                xmlSBufAddReplChar(buf);
                str += 1;
                chunk = str;
            } else {
                str += 1;
            }
        }
    }

    if (chunk < str)
        xmlSBufAddString(buf, chunk, str - chunk);
}